

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O0

void __thiscall
opengv::math::Bracket::Bracket
          (Bracket *this,double lowerBound,double upperBound,size_t changes,
          bool setUpperBoundChanges)

{
  bool setUpperBoundChanges_local;
  size_t changes_local;
  double upperBound_local;
  double lowerBound_local;
  Bracket *this_local;
  
  this->_vptr_Bracket = (_func_int **)&PTR__Bracket_0144fc38;
  this->_lowerBound = lowerBound;
  this->_upperBound = upperBound;
  this->_lowerBoundChangesComputed = false;
  this->_upperBoundChangesComputed = false;
  this->_lowerBoundChanges = 0;
  this->_upperBoundChanges = 0;
  if (setUpperBoundChanges) {
    this->_upperBoundChanges = changes;
    this->_upperBoundChangesComputed = true;
  }
  else {
    this->_lowerBoundChanges = changes;
    this->_lowerBoundChangesComputed = true;
  }
  return;
}

Assistant:

opengv::math::Bracket::Bracket(
    double lowerBound, double upperBound, size_t changes, bool setUpperBoundChanges ) :
    _lowerBound(lowerBound),
    _upperBound(upperBound),
    _lowerBoundChangesComputed(false),
    _upperBoundChangesComputed(false),
    _lowerBoundChanges(0),
    _upperBoundChanges(0)
{
  if( setUpperBoundChanges )
  {
    _upperBoundChanges = changes;
    _upperBoundChangesComputed = true;
  }
  else
  {
    _lowerBoundChanges = changes;
    _lowerBoundChangesComputed = true;
  }
}